

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# default_session.hpp
# Opt level: O0

native_handle_type binlog::detail::this_thread_id_string_abi_cxx11_(void)

{
  basic_ostream<char,_std::char_traits<char>_> *in_RDI;
  ostringstream str;
  id __id;
  ostringstream local_180 [384];
  
  __id._M_thread = (native_handle_type)in_RDI;
  std::__cxx11::ostringstream::ostringstream(local_180);
  std::this_thread::get_id();
  std::operator<<(in_RDI,__id);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_180);
  return __id._M_thread;
}

Assistant:

inline std::string this_thread_id_string()
{
  std::ostringstream str;
  str << std::this_thread::get_id();
  return str.str();
}